

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

bool cmSystemTools::RunSingleCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *command,string *captureStdOut,string *captureStdErr,int *retVal,char *dir,
               OutputOption outputflag,double timeout,Encoding encoding)

{
  undefined1 *puVar1;
  bool bVar2;
  int iVar3;
  cmsysProcess *cp_00;
  reference command_00;
  char *pcVar4;
  size_t sVar5;
  ulong uVar6;
  ostream *poVar7;
  char *error_str_1;
  char *error_str;
  char *exception_str;
  undefined1 local_1d8 [7];
  bool result;
  char *local_1b8;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_1b0;
  string local_1a8;
  char *local_188;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_180;
  string local_178;
  string local_158;
  char *local_138;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_130;
  const_iterator local_128;
  char *local_120;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_118;
  const_iterator local_110;
  int local_104;
  undefined1 local_100 [4];
  int i;
  string strdata;
  int iStack_d4;
  cmProcessOutput processOutput;
  int pipe;
  int length;
  char *data;
  vector<char,_std::allocator<char>_> tempStdErr;
  vector<char,_std::allocator<char>_> tempStdOut;
  cmsysProcess *cp;
  value_type local_70;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_68;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  const_iterator a;
  vector<const_char_*,_std::allocator<const_char_*>_> argv;
  double timeout_local;
  OutputOption outputflag_local;
  char *dir_local;
  int *retVal_local;
  string *captureStdErr_local;
  string *captureStdOut_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *command_local;
  
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)&a);
  local_60._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(command);
  while( true ) {
    local_68._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(command);
    bVar2 = __gnu_cxx::operator!=(&local_60,&local_68);
    if (!bVar2) break;
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator->(&local_60);
    local_70 = (value_type)std::__cxx11::string::c_str();
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)&a,&local_70);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_60);
  }
  cp = (cmsysProcess *)0x0;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)&a,(value_type *)&cp);
  cp_00 = cmsysProcess_New();
  tempStdOut.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ =
       std::vector<const_char_*,_std::allocator<const_char_*>_>::begin
                 ((vector<const_char_*,_std::allocator<const_char_*>_> *)&a);
  command_00 = __gnu_cxx::
               __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
               ::operator*((__normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                            *)&tempStdOut.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               field_0x10);
  cmsysProcess_SetCommand(cp_00,command_00);
  cmsysProcess_SetWorkingDirectory(cp_00,dir);
  bVar2 = GetRunCommandHideConsole();
  if (bVar2) {
    cmsysProcess_SetOption(cp_00,0,1);
  }
  if (outputflag == OUTPUT_PASSTHROUGH) {
    cmsysProcess_SetPipeShared(cp_00,2,1);
    cmsysProcess_SetPipeShared(cp_00,3,1);
    captureStdErr_local = (string *)0x0;
    retVal_local = (int *)0x0;
  }
  else {
    captureStdErr_local = captureStdOut;
    if ((outputflag == OUTPUT_MERGE) ||
       ((retVal_local = (int *)captureStdErr, captureStdErr != (string *)0x0 &&
        (captureStdErr == captureStdOut)))) {
      cmsysProcess_SetOption(cp_00,2,1);
      retVal_local = (int *)0x0;
    }
  }
  if (retVal_local != (int *)0x0 && (string *)retVal_local == captureStdErr_local) {
    __assert_fail("!captureStdErr || captureStdErr != captureStdOut",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmSystemTools.cxx"
                  ,0x2a4,
                  "static bool cmSystemTools::RunSingleCommand(const std::vector<std::string> &, std::string *, std::string *, int *, const char *, OutputOption, double, Encoding)"
                 );
  }
  cmsysProcess_SetTimeout(cp_00,timeout);
  cmsysProcess_Execute(cp_00);
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)
             &tempStdErr.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)&data);
  cmProcessOutput::cmProcessOutput
            ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xf),encoding,0x400);
  std::__cxx11::string::string((string *)local_100);
  if ((outputflag != OUTPUT_PASSTHROUGH) &&
     (((captureStdErr_local != (string *)0x0 || (retVal_local != (int *)0x0)) ||
      (outputflag != OUTPUT_NONE)))) {
    while (iVar3 = cmsysProcess_WaitForData
                             (cp_00,(char **)&pipe,&stack0xffffffffffffff2c,(double *)0x0),
          0 < iVar3) {
      for (local_104 = 0; local_104 < iStack_d4; local_104 = local_104 + 1) {
        if (_pipe[local_104] == '\0') {
          _pipe[local_104] = ' ';
        }
      }
      if (iVar3 == 2) {
        if (outputflag != OUTPUT_NONE) {
          cmProcessOutput::DecodeText
                    ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xf),_pipe,(long)iStack_d4,
                     (string *)local_100,1);
          pcVar4 = (char *)std::__cxx11::string::c_str();
          sVar5 = std::__cxx11::string::size();
          Stdout(pcVar4,sVar5);
        }
        if (captureStdErr_local != (string *)0x0) {
          puVar1 = &tempStdErr.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10;
          local_118._M_current =
               (char *)std::vector<char,_std::allocator<char>_>::end
                                 ((vector<char,_std::allocator<char>_> *)puVar1);
          __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
          __normal_iterator<char*>
                    ((__normal_iterator<char_const*,std::vector<char,std::allocator<char>>> *)
                     &local_110,&local_118);
          local_120 = (char *)std::vector<char,std::allocator<char>>::insert<char*,void>
                                        ((vector<char,std::allocator<char>> *)puVar1,local_110,_pipe
                                         ,_pipe + iStack_d4);
        }
      }
      else if (iVar3 == 3) {
        if (outputflag != OUTPUT_NONE) {
          cmProcessOutput::DecodeText
                    ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xf),_pipe,(long)iStack_d4,
                     (string *)local_100,2);
          pcVar4 = (char *)std::__cxx11::string::c_str();
          sVar5 = std::__cxx11::string::size();
          Stderr(pcVar4,sVar5);
        }
        if (retVal_local != (int *)0x0) {
          local_130._M_current =
               (char *)std::vector<char,_std::allocator<char>_>::end
                                 ((vector<char,_std::allocator<char>_> *)&data);
          __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
          __normal_iterator<char*>
                    ((__normal_iterator<char_const*,std::vector<char,std::allocator<char>>> *)
                     &local_128,&local_130);
          local_138 = (char *)std::vector<char,std::allocator<char>>::insert<char*,void>
                                        ((vector<char,std::allocator<char>> *)&data,local_128,_pipe,
                                         _pipe + iStack_d4);
        }
      }
    }
    if (outputflag != OUTPUT_NONE) {
      std::__cxx11::string::string((string *)&local_158);
      cmProcessOutput::DecodeText
                ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xf),&local_158,
                 (string *)local_100,1);
      std::__cxx11::string::~string((string *)&local_158);
      uVar6 = std::__cxx11::string::empty();
      if ((uVar6 & 1) == 0) {
        pcVar4 = (char *)std::__cxx11::string::c_str();
        sVar5 = std::__cxx11::string::size();
        Stdout(pcVar4,sVar5);
      }
      std::__cxx11::string::string((string *)&local_178);
      cmProcessOutput::DecodeText
                ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xf),&local_178,
                 (string *)local_100,2);
      std::__cxx11::string::~string((string *)&local_178);
      uVar6 = std::__cxx11::string::empty();
      if ((uVar6 & 1) == 0) {
        pcVar4 = (char *)std::__cxx11::string::c_str();
        sVar5 = std::__cxx11::string::size();
        Stderr(pcVar4,sVar5);
      }
    }
  }
  cmsysProcess_WaitForExit(cp_00,(double *)0x0);
  if (captureStdErr_local != (string *)0x0) {
    puVar1 = &tempStdErr.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10;
    local_180._M_current =
         (char *)std::vector<char,_std::allocator<char>_>::begin
                           ((vector<char,_std::allocator<char>_> *)puVar1);
    local_188 = (char *)std::vector<char,_std::allocator<char>_>::end
                                  ((vector<char,_std::allocator<char>_> *)puVar1);
    std::__cxx11::string::
    assign<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
              ((string *)captureStdErr_local,local_180,
               (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)local_188);
    std::__cxx11::string::string((string *)&local_1a8,(string *)captureStdErr_local);
    cmProcessOutput::DecodeText
              ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xf),&local_1a8,
               captureStdErr_local,0);
    std::__cxx11::string::~string((string *)&local_1a8);
  }
  if (retVal_local != (int *)0x0) {
    local_1b0._M_current =
         (char *)std::vector<char,_std::allocator<char>_>::begin
                           ((vector<char,_std::allocator<char>_> *)&data);
    local_1b8 = (char *)std::vector<char,_std::allocator<char>_>::end
                                  ((vector<char,_std::allocator<char>_> *)&data);
    std::__cxx11::string::
    assign<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
              ((string *)retVal_local,local_1b0,
               (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)local_1b8);
    std::__cxx11::string::string((string *)local_1d8,(string *)retVal_local);
    cmProcessOutput::DecodeText
              ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xf),(string *)local_1d8,
               (string *)retVal_local,0);
    std::__cxx11::string::~string((string *)local_1d8);
  }
  exception_str._7_1_ = true;
  iVar3 = cmsysProcess_GetState(cp_00);
  if (iVar3 == 4) {
    if (retVal == (int *)0x0) {
      iVar3 = cmsysProcess_GetExitValue(cp_00);
      exception_str._7_1_ = iVar3 == 0;
    }
    else {
      iVar3 = cmsysProcess_GetExitValue(cp_00);
      *retVal = iVar3;
    }
  }
  else {
    iVar3 = cmsysProcess_GetState(cp_00);
    if (iVar3 == 2) {
      pcVar4 = cmsysProcess_GetExceptionString(cp_00);
      if (outputflag != OUTPUT_NONE) {
        poVar7 = std::operator<<((ostream *)&std::cerr,pcVar4);
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      }
      if (retVal_local != (int *)0x0) {
        strlen(pcVar4);
        std::__cxx11::string::append((char *)retVal_local,(ulong)pcVar4);
      }
      exception_str._7_1_ = false;
    }
    else {
      iVar3 = cmsysProcess_GetState(cp_00);
      if (iVar3 == 1) {
        pcVar4 = cmsysProcess_GetErrorString(cp_00);
        if (outputflag != OUTPUT_NONE) {
          poVar7 = std::operator<<((ostream *)&std::cerr,pcVar4);
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        }
        if (retVal_local != (int *)0x0) {
          strlen(pcVar4);
          std::__cxx11::string::append((char *)retVal_local,(ulong)pcVar4);
        }
        exception_str._7_1_ = false;
      }
      else {
        iVar3 = cmsysProcess_GetState(cp_00);
        if (iVar3 == 5) {
          if (outputflag != OUTPUT_NONE) {
            poVar7 = std::operator<<((ostream *)&std::cerr,"Process terminated due to timeout\n");
            std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          }
          if (retVal_local != (int *)0x0) {
            strlen("Process terminated due to timeout\n");
            std::__cxx11::string::append((char *)retVal_local,0xa0f52a);
          }
          exception_str._7_1_ = false;
        }
      }
    }
  }
  cmsysProcess_Delete(cp_00);
  std::__cxx11::string::~string((string *)local_100);
  cmProcessOutput::~cmProcessOutput((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xf));
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)&data);
  std::vector<char,_std::allocator<char>_>::~vector
            ((vector<char,_std::allocator<char>_> *)
             &tempStdErr.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)&a);
  return exception_str._7_1_;
}

Assistant:

bool cmSystemTools::RunSingleCommand(std::vector<std::string> const& command,
                                     std::string* captureStdOut,
                                     std::string* captureStdErr, int* retVal,
                                     const char* dir, OutputOption outputflag,
                                     double timeout, Encoding encoding)
{
  std::vector<const char*> argv;
  for (std::vector<std::string>::const_iterator a = command.begin();
       a != command.end(); ++a) {
    argv.push_back(a->c_str());
  }
  argv.push_back(CM_NULLPTR);

  cmsysProcess* cp = cmsysProcess_New();
  cmsysProcess_SetCommand(cp, &*argv.begin());
  cmsysProcess_SetWorkingDirectory(cp, dir);
  if (cmSystemTools::GetRunCommandHideConsole()) {
    cmsysProcess_SetOption(cp, cmsysProcess_Option_HideWindow, 1);
  }

  if (outputflag == OUTPUT_PASSTHROUGH) {
    cmsysProcess_SetPipeShared(cp, cmsysProcess_Pipe_STDOUT, 1);
    cmsysProcess_SetPipeShared(cp, cmsysProcess_Pipe_STDERR, 1);
    captureStdOut = CM_NULLPTR;
    captureStdErr = CM_NULLPTR;
  } else if (outputflag == OUTPUT_MERGE ||
             (captureStdErr && captureStdErr == captureStdOut)) {
    cmsysProcess_SetOption(cp, cmsysProcess_Option_MergeOutput, 1);
    captureStdErr = CM_NULLPTR;
  }
  assert(!captureStdErr || captureStdErr != captureStdOut);

  cmsysProcess_SetTimeout(cp, timeout);
  cmsysProcess_Execute(cp);

  std::vector<char> tempStdOut;
  std::vector<char> tempStdErr;
  char* data;
  int length;
  int pipe;
  cmProcessOutput processOutput(encoding);
  std::string strdata;
  if (outputflag != OUTPUT_PASSTHROUGH &&
      (captureStdOut || captureStdErr || outputflag != OUTPUT_NONE)) {
    while ((pipe = cmsysProcess_WaitForData(cp, &data, &length, CM_NULLPTR)) >
           0) {
      // Translate NULL characters in the output into valid text.
      for (int i = 0; i < length; ++i) {
        if (data[i] == '\0') {
          data[i] = ' ';
        }
      }

      if (pipe == cmsysProcess_Pipe_STDOUT) {
        if (outputflag != OUTPUT_NONE) {
          processOutput.DecodeText(data, length, strdata, 1);
          cmSystemTools::Stdout(strdata.c_str(), strdata.size());
        }
        if (captureStdOut) {
          tempStdOut.insert(tempStdOut.end(), data, data + length);
        }
      } else if (pipe == cmsysProcess_Pipe_STDERR) {
        if (outputflag != OUTPUT_NONE) {
          processOutput.DecodeText(data, length, strdata, 2);
          cmSystemTools::Stderr(strdata.c_str(), strdata.size());
        }
        if (captureStdErr) {
          tempStdErr.insert(tempStdErr.end(), data, data + length);
        }
      }
    }

    if (outputflag != OUTPUT_NONE) {
      processOutput.DecodeText(std::string(), strdata, 1);
      if (!strdata.empty()) {
        cmSystemTools::Stdout(strdata.c_str(), strdata.size());
      }
      processOutput.DecodeText(std::string(), strdata, 2);
      if (!strdata.empty()) {
        cmSystemTools::Stderr(strdata.c_str(), strdata.size());
      }
    }
  }

  cmsysProcess_WaitForExit(cp, CM_NULLPTR);

  if (captureStdOut) {
    captureStdOut->assign(tempStdOut.begin(), tempStdOut.end());
    processOutput.DecodeText(*captureStdOut, *captureStdOut);
  }
  if (captureStdErr) {
    captureStdErr->assign(tempStdErr.begin(), tempStdErr.end());
    processOutput.DecodeText(*captureStdErr, *captureStdErr);
  }

  bool result = true;
  if (cmsysProcess_GetState(cp) == cmsysProcess_State_Exited) {
    if (retVal) {
      *retVal = cmsysProcess_GetExitValue(cp);
    } else {
      if (cmsysProcess_GetExitValue(cp) != 0) {
        result = false;
      }
    }
  } else if (cmsysProcess_GetState(cp) == cmsysProcess_State_Exception) {
    const char* exception_str = cmsysProcess_GetExceptionString(cp);
    if (outputflag != OUTPUT_NONE) {
      std::cerr << exception_str << std::endl;
    }
    if (captureStdErr) {
      captureStdErr->append(exception_str, strlen(exception_str));
    }
    result = false;
  } else if (cmsysProcess_GetState(cp) == cmsysProcess_State_Error) {
    const char* error_str = cmsysProcess_GetErrorString(cp);
    if (outputflag != OUTPUT_NONE) {
      std::cerr << error_str << std::endl;
    }
    if (captureStdErr) {
      captureStdErr->append(error_str, strlen(error_str));
    }
    result = false;
  } else if (cmsysProcess_GetState(cp) == cmsysProcess_State_Expired) {
    const char* error_str = "Process terminated due to timeout\n";
    if (outputflag != OUTPUT_NONE) {
      std::cerr << error_str << std::endl;
    }
    if (captureStdErr) {
      captureStdErr->append(error_str, strlen(error_str));
    }
    result = false;
  }

  cmsysProcess_Delete(cp);
  return result;
}